

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool google::protobuf::internal::MergeFromImpl<false>
               (ZeroCopyInputStream *input,MessageLite *msg,ParseFlags parse_flags)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ParseFlags parse_flags_00;
  char *ptr;
  ParseContext ctx;
  char *local_b0;
  ZeroCopyInputStream *local_a8;
  ParseContext local_a0;
  
  local_a8 = input;
  ParseContext::ParseContext<google::protobuf::io::ZeroCopyInputStream*&>
            (&local_a0,io::CodedInputStream::default_recursion_limit_,false,&local_b0,&local_a8);
  iVar2 = (*msg->_vptr_MessageLite[10])(msg,local_b0,&local_a0);
  local_b0 = (char *)CONCAT44(extraout_var,iVar2);
  bVar1 = false;
  if ((local_b0 != (char *)0x0) &&
     (bVar1 = false, local_a0.super_EpsCopyInputStream.last_tag_minus_1_ == 1)) {
    bVar1 = anon_unknown_13::CheckFieldPresence
                      ((ParseContext *)msg,(MessageLite *)(ulong)parse_flags,parse_flags_00);
  }
  return bVar1;
}

Assistant:

bool MergeFromImpl(io::ZeroCopyInputStream* input, MessageLite* msg,
                   MessageLite::ParseFlags parse_flags) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input);
  ptr = msg->_InternalParse(ptr, &ctx);
  // ctx has no explicit limit (hence we end on end of stream)
  if (PROTOBUF_PREDICT_TRUE(ptr && ctx.EndedAtEndOfStream())) {
    return CheckFieldPresence(ctx, *msg, parse_flags);
  }
  return false;
}